

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::InternalException::InternalException<unsigned_long,unsigned_char,unsigned_char>
          (InternalException *this,string *msg,unsigned_long params,uchar params_1,uchar params_2)

{
  undefined7 in_register_00000009;
  uchar in_R9B;
  string local_30;
  
  Exception::ConstructMessage<unsigned_long,unsigned_char,unsigned_char>
            (&local_30,(Exception *)msg,(string *)params,CONCAT71(in_register_00000009,params_1),
             params_2,in_R9B);
  InternalException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}